

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConcatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  key_type *__k;
  bool bVar4;
  undefined1 *puVar5;
  Type *pTVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  void **ppvVar9;
  Result *_result;
  long lVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  _Rb_tree_header *p_Var11;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,2,-1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar4 = Result::good(__return_storage_ptr__);
    if (bVar4) {
      std::__cxx11::string::~string((string *)this_00);
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Concat",(allocator<char> *)&err);
        this_01 = &this->blobNameToRank;
        validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,this_01);
        std::__cxx11::string::~string((string *)&local_50);
        bVar4 = Result::good(__return_storage_ptr__);
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        if (layer->_oneof_case_[0] == 0x140) {
          puVar5 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar5 = Specification::_ConcatLayerParams_default_instance_;
        }
        if (((MeanVarianceNormalizeLayerParams *)puVar5)->acrosschannels_ == true) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"Concat",(allocator<char> *)&local_70);
          validateRankCount(__return_storage_ptr__,layer,&err,5,-1,this_01);
          std::__cxx11::string::~string((string *)&err);
          bVar4 = Result::good(__return_storage_ptr__);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"Concat",(allocator<char> *)&local_70);
          validateRankCount(__return_storage_ptr__,layer,&err,3,-1,this_01);
          std::__cxx11::string::~string((string *)&err);
          bVar4 = Result::good(__return_storage_ptr__);
        }
        if (bVar4 == false) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&(layer->input_).super_RepeatedPtrFieldBase,0);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_01->_M_t,pTVar6);
        p_Var11 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar7._M_node != p_Var11) {
          lVar10 = 0;
          pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(layer->input_).super_RepeatedPtrFieldBase,0);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_01,pTVar6);
          iVar1 = *pmVar8;
          pRVar3 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
          ppvVar9 = pRVar3->elements;
          if (pRVar3 == (Rep *)0x0) {
            ppvVar9 = (void **)0x0;
          }
          iVar2 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
          for (; (long)iVar2 * 8 != lVar10; lVar10 = lVar10 + 8) {
            __k = *(key_type **)((long)ppvVar9 + lVar10);
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find(&this_01->_M_t,__k);
            if (((_Rb_tree_header *)iVar7._M_node != p_Var11) &&
               (pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::at(this_01,__k), iVar1 != *pmVar8)) {
              err._M_dataplus._M_p = (pointer)&err.field_2;
              err._M_string_length = 0;
              err.field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::string
                        ((string *)&local_b0,
                         (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
              std::operator+(&local_90,"Layer \'",&local_b0);
              std::operator+(&local_70,&local_90,
                             "\' of type \'Concat\' expects equal ranks for its inputs, but they are not equal."
                            );
              std::__cxx11::string::operator=((string *)&err,(string *)&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_b0);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
              std::__cxx11::string::~string((string *)&err);
              return __return_storage_ptr__;
            }
          }
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConcatLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Concat", blobNameToRank));

        if (layer.concat().sequenceconcat()) {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Concat", 5, -1, blobNameToRank));
        } else {
            HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Concat", 3, -1, blobNameToRank));
        }

        // check that all inputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.input(0));
        } else {
            return Result();
        }

        for (const auto& input : layer.input()) {
            if (blobNameToRank.find(input) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(input)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Concat' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}